

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O2

bool TestConstants(void)

{
  return true;
}

Assistant:

bool TestConstants()
{
    TEST_CHECK(TestConstantsF_NoPadding<Counter64>());
    TEST_CHECK(TestConstantsF_Padding<Counter48>());
    TEST_CHECK(TestConstantsF_NoPadding<Counter32>());
    TEST_CHECK(TestConstantsF_Padding<Counter24>());
    TEST_CHECK(TestConstantsF_NoPadding<Counter16>());
    TEST_CHECK(TestConstantsF_Padding<Counter10>());
    TEST_CHECK(TestConstantsF_NoPadding<Counter8>());
    TEST_CHECK(TestConstantsF_Padding<Counter4>());
    return true;
}